

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

bool __thiscall
spirv_cross::ParsedIR::has_member_decoration
          (ParsedIR *this,TypeID id,uint32_t index,Decoration decoration)

{
  bool bVar1;
  Bitset *this_00;
  Decoration decoration_local;
  uint32_t index_local;
  ParsedIR *this_local;
  TypeID id_local;
  
  this_00 = get_member_decoration_bitset(this,id,index);
  bVar1 = Bitset::get(this_00,decoration);
  return bVar1;
}

Assistant:

bool ParsedIR::has_member_decoration(TypeID id, uint32_t index, Decoration decoration) const
{
	return get_member_decoration_bitset(id, index).get(decoration);
}